

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O1

void Pf_StoCreateGate(Pf_Man_t *pMan,Mio_Cell_t *pCell,int **pComp,int **pPerm,int *pnPerms)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uTruth;
  long lVar7;
  ulong uVar8;
  int Perm [6];
  uint local_68 [8];
  int **local_48;
  ulong local_40;
  ulong local_38;
  
  uVar1 = *(uint *)&pCell->field_0x8;
  uVar2 = pnPerms[uVar1 >> 0x1c];
  local_48 = pPerm;
  if (0xfffffff < uVar1) {
    uVar6 = 0;
    do {
      *(int *)((long)local_68 + uVar6 * 2) = (int)uVar6;
      uVar6 = uVar6 + 2;
    } while ((uVar1 >> 0x1c) * 2 != uVar6);
  }
  uVar6 = pCell->uTruth;
  uTruth = uVar6;
  if (0 < (int)uVar2) {
    uVar8 = 0;
    do {
      lVar7 = 0;
      local_40 = uTruth;
      local_38 = uVar8;
      do {
        Pf_StoCreateGateAdd(pMan,uTruth,(int *)local_68,*(uint *)&pCell->field_0x8 >> 0x1c,
                            *(uint *)&pCell->field_0x8 & 0xfffffff);
        iVar3 = pComp[*(uint *)&pCell->field_0x8 >> 0x1c][lVar7];
        if ((int)local_68[iVar3] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10e,"int Abc_LitNot(int)");
        }
        bVar5 = (byte)(1 << ((byte)iVar3 & 0x1f));
        uTruth = uTruth << (bVar5 & 0x3f) & s_Truths6[iVar3] |
                 (s_Truths6[iVar3] & uTruth) >> (bVar5 & 0x3f);
        local_68[iVar3] = local_68[iVar3] ^ 1;
        uVar8 = local_38;
        lVar7 = lVar7 + 1;
      } while ((uint)lVar7 >> (byte)(uVar1 >> 0x1c) == 0);
      if (local_40 != uTruth) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                      ,0xc3,"void Pf_StoCreateGate(Pf_Man_t *, Mio_Cell_t *, int **, int **, int *)"
                     );
      }
      iVar3 = local_48[*(uint *)&pCell->field_0x8 >> 0x1c][local_38];
      bVar5 = (byte)(1L << ((byte)iVar3 & 0x3f));
      uTruth = (uTruth & s_PMasks[iVar3][2]) >> (bVar5 & 0x3f) |
               (s_PMasks[iVar3][1] & uTruth) << (bVar5 & 0x3f) | s_PMasks[iVar3][0] & uTruth;
      uVar4 = local_68[iVar3];
      local_68[iVar3] = local_68[(long)iVar3 + 1];
      local_68[(long)iVar3 + 1] = uVar4;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar2);
  }
  if (uVar6 == uTruth) {
    return;
  }
  __assert_fail("tTemp1 == tCur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                ,0xca,"void Pf_StoCreateGate(Pf_Man_t *, Mio_Cell_t *, int **, int **, int *)");
}

Assistant:

void Pf_StoCreateGate( Pf_Man_t * pMan, Mio_Cell_t * pCell, int ** pComp, int ** pPerm, int * pnPerms )
{
    int Perm[PF_LEAF_MAX], * Perm1, * Perm2;
    int nPerms = pnPerms[pCell->nFanins];
    int nMints = (1 << pCell->nFanins);
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        Perm[i] = Abc_Var2Lit( i, 0 );
    tCur = tTemp1 = pCell->uTruth;
    for ( p = 0; p < nPerms; p++ )
    {
        tTemp2 = tCur;
        for ( c = 0; c < nMints; c++ )
        {
            Pf_StoCreateGateAdd( pMan, tCur, Perm, pCell->nFanins, pCell->Id );
            // update
            tCur  = Abc_Tt6Flip( tCur, pComp[pCell->nFanins][c] );
            Perm1 = Perm + pComp[pCell->nFanins][c];
            *Perm1 = Abc_LitNot( *Perm1 );
        }
        assert( tTemp2 == tCur );
        // update
        tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[pCell->nFanins][p] );
        Perm1 = Perm + pPerm[pCell->nFanins][p];
        Perm2 = Perm1 + 1;
        ABC_SWAP( int, *Perm1, *Perm2 );
    }
    assert( tTemp1 == tCur );
}